

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint flatbuffers::HashFnv1<unsigned_int>(char *input)

{
  byte *local_20;
  char *c;
  uint hash;
  char *input_local;
  
  c._4_4_ = 0x811c9dc5;
  for (local_20 = (byte *)input; *local_20 != 0; local_20 = local_20 + 1) {
    c._4_4_ = (uint)*local_20 ^ c._4_4_ * 0x1000193;
  }
  return c._4_4_;
}

Assistant:

T HashFnv1(const char *input) {
  T hash = FnvTraits<T>::kOffsetBasis;
  for (const char *c = input; *c; ++c) {
    hash *= FnvTraits<T>::kFnvPrime;
    hash ^= static_cast<unsigned char>(*c);
  }
  return hash;
}